

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O1

void __thiscall Metrics::Report(Metrics *this)

{
  pointer ppMVar1;
  Metric *pMVar2;
  uint uVar3;
  pointer ppMVar4;
  uint uVar5;
  
  ppMVar4 = (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar1 = (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar4 == ppMVar1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar3 = (uint)((*ppMVar4)->name)._M_string_length;
      if ((int)uVar3 < (int)uVar5) {
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
      ppMVar4 = ppMVar4 + 1;
    } while (ppMVar4 != ppMVar1);
  }
  printf("%-*s\t%-6s\t%-9s\t%s\n",(ulong)uVar5,"metric","count","avg (us)","total (ms)");
  ppMVar4 = (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar4 !=
      (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pMVar2 = *ppMVar4;
      printf("%-*s\t%-6d\t%-8.1f\t%.1f\n",(double)pMVar2->sum / (double)pMVar2->count,
             (double)pMVar2->sum / 1000.0,(ulong)uVar5,(pMVar2->name)._M_dataplus._M_p);
      ppMVar4 = ppMVar4 + 1;
    } while (ppMVar4 !=
             (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Metrics::Report() {
  int width = 0;
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    width = max((int)(*i)->name.size(), width);
  }

  printf("%-*s\t%-6s\t%-9s\t%s\n", width,
         "metric", "count", "avg (us)", "total (ms)");
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    Metric* metric = *i;
    double total = metric->sum / (double)1000;
    double avg = metric->sum / (double)metric->count;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n", width, metric->name.c_str(),
           metric->count, avg, total);
  }
}